

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O0

double __thiscall NEST::LArNEST::GetDriftVelocity_Liquid(LArNEST *this,double Kelvin,double efield)

{
  double dVar1;
  double dVar2;
  size_type sVar3;
  reference pvVar4;
  double dVar5;
  double dVar6;
  double speed;
  size_t i;
  double efield_local;
  double Kelvin_local;
  LArNEST *this_local;
  
  if ((Kelvin < 84.0) || (efield_local = Kelvin, 140.0 < Kelvin)) {
    std::operator<<((ostream *)&std::cerr,"\nWARNING: TEMPERATURE OUT OF RANGE (84-140 K) for vD\n")
    ;
    std::operator<<((ostream *)&std::cerr,"Using value at closest temp for a drift speed estimate\n"
                   );
    if (84.0 <= Kelvin) {
      efield_local = 140.0;
    }
    else {
      efield_local = 84.0;
    }
  }
  speed = 0.0;
  while( true ) {
    sVar3 = std::vector<double,_std::allocator<double>_>::size(&(this->fDriftParameters).A);
    if (sVar3 - 1 <= (ulong)speed) {
      return 0.0;
    }
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&(this->fDriftParameters).TempLow,(size_type)speed);
    if ((*pvVar4 <= efield_local) &&
       (pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&(this->fDriftParameters).TempHigh,(long)speed + 1),
       efield_local < *pvVar4)) break;
    speed = (double)((long)speed + 1);
  }
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&(this->fDriftParameters).A,(size_type)speed);
  dVar6 = *pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&(this->fDriftParameters).B,(size_type)speed);
  dVar1 = *pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&(this->fDriftParameters).C,(size_type)speed);
  dVar2 = *pvVar4;
  dVar5 = log(efield / 1000.0);
  dVar6 = exp(dVar2 * dVar5 + dVar6 + dVar1 / (efield / 1000.0));
  if (0.0 < dVar6) {
    return dVar6;
  }
  return 0.0;
}

Assistant:

double LArNEST::GetDriftVelocity_Liquid(double Kelvin, double efield) {
  // returns drift speed in mm/usec. based on Fig. 14 arXiv:1712.08607
  if (Kelvin < 84. || Kelvin > 140.) {
    cerr << "\nWARNING: TEMPERATURE OUT OF RANGE (84-140 K) for vD\n";
    cerr << "Using value at closest temp for a drift speed estimate\n";
    if (Kelvin < 84.) {
      Kelvin = 84.;
    } else {
      Kelvin = 140.;
    }
  }
  for (size_t i = 0; i < fDriftParameters.A.size() - 1; i++) {
    if (Kelvin >= fDriftParameters.TempLow[i] and
        Kelvin < fDriftParameters.TempHigh[i + 1]) {
      double speed =
          exp(fDriftParameters.A[i] + fDriftParameters.B[i] / (efield / 1000) +
              fDriftParameters.C[i] * log(efield / 1000));
      if (speed > 0.0) {
        return speed;
      } else {
        return 0.0;
      }
    }
  }
  return 0.0;
}